

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readokt.c
# Opt level: O0

void free_okt(IFF_CHUNKED *mod)

{
  uint *in_RDI;
  uint i;
  uint local_c;
  
  if (in_RDI != (uint *)0x0) {
    if (*(long *)(in_RDI + 2) != 0) {
      for (local_c = 0; local_c < *in_RDI; local_c = local_c + 1) {
        if (*(long *)(*(long *)(in_RDI + 2) + (ulong)local_c * 0x18 + 8) != 0) {
          free(*(void **)(*(long *)(in_RDI + 2) + (ulong)local_c * 0x18 + 8));
        }
      }
      free(*(void **)(in_RDI + 2));
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void free_okt(IFF_CHUNKED * mod)
{
	unsigned i;
	if (mod)
	{
		if (mod->chunks)
		{
			for (i = 0; i < mod->chunk_count; i++)
			{
				if (mod->chunks[i].data) free(mod->chunks[i].data);
			}
			free(mod->chunks);
		}
		free(mod);
	}
}